

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O1

HPDF_UINT HPDF_StrLen(char *s,HPDF_INT maxlen)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  if ((s != (char *)0x0) && (*s != '\0')) {
    lVar3 = 0;
    do {
      if (maxlen <= (int)(HPDF_UINT)lVar3 && -1 < maxlen) {
        return (HPDF_UINT)lVar3;
      }
      lVar2 = lVar3 + 1;
      lVar1 = lVar3 + 1;
      lVar3 = lVar2;
    } while (s[lVar1] != '\0');
  }
  return (HPDF_UINT)lVar2;
}

Assistant:

HPDF_UINT
HPDF_StrLen  (const char   *s,
              HPDF_INT      maxlen)
{
    HPDF_INT len = 0;

    if (!s)
        return 0;

    while (*s != 0 && (maxlen < 0 || len < maxlen)) {
        s++;
        len++;
    }

    return (HPDF_UINT)len;
}